

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
::~ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
                   *this)

{
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca4fa0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca5098;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca50d0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca50e8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca5100;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca5118;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca5148;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca5188;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca51a8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca51c0;
  (this->super_Delegate).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_wd1770_did_change_output_00ca51d8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca51f8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca5210;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_00ca5230;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  ~unique_ptr(&this->string_serialiser_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->pravetz_rom_);
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::~JustInTimeActor(&this->diskii_);
  BD500::~BD500(&this->bd500_);
  Jasmin::~Jasmin(&this->jasmin_);
  Microdisc::~Microdisc(&this->microdisc_);
  VIAPortHandler::~VIAPortHandler(&this->via_port_handler_);
  TapePlayer::~TapePlayer(&this->tape_player_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::~PullLowpass(&this->speaker_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::~JustInTimeActor(&this->video_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->disk_rom_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->rom_);
  Oric::Machine::~Machine(&this->super_Machine);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}